

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

double __thiscall libDAI::NDP::run(NDP *this)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  Exception *this_00;
  ulong i_th_var;
  allocator<char> local_99;
  double local_98;
  tms ts_before;
  string local_70;
  tms ts_after;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  this->bestValue = -INFINITY;
  if (1 < (this->Props).verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&ts_before,this);
    poVar2 = std::operator<<(poVar2,(string *)&ts_before);
    poVar2 = std::operator<<(poVar2,"...");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&ts_before);
    if (2 < (this->Props).verbose) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  times((tms *)&ts_before);
  ComputeHeuristicVariableOrdering(this);
  i_th_var = 0;
  do {
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar1));
    if (uVar3 <= i_th_var) {
      local_98 = ConstructOptimalAssignments(this);
      if ((this->Props).verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"NDP done. Induced width was ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      return local_98;
    }
    if (0.0 < this->_m_deadlineInSeconds) {
      times((tms *)&ts_after);
      local_98 = (double)(ts_after.tms_utime - ts_before.tms_utime);
      lVar4 = sysconf(2);
      if (this->_m_deadlineInSeconds < local_98 / (double)lVar4) {
        this_00 = (Exception *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"ndp.cpp, line 198",&local_99);
        Exception::Exception(this_00,0xb,&local_70);
        __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    EliminateVariable(this,i_th_var);
    i_th_var = i_th_var + 1;
  } while( true );
}

Assistant:

double NDP::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        tms ts_before, ts_after;
        times(&ts_before);

        //struct timeval start_time, cur_time;
        //if(gettimeofday(&start_time, NULL) != 0)
            //throw "Error with gettimeofday";
        //clock_t tic = toc();

        // 0) some initialization

        // 1) create a heuristic ordering of the variables to eliminate
        ComputeHeuristicVariableOrdering();
        
        // 2) eliminate the variables one by one
        for(size_t i=0; i < g.nrVars(); i++)
        {
            // make sure we don't use too much time
            if(_m_deadlineInSeconds>0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
                if(timeSpentInS>_m_deadlineInSeconds)
                    DAI_THROW(INTERNAL_ERROR);
            }
            EliminateVariable(i);
        }
        // 3) construct the k optimal assignments
        double val = ConstructOptimalAssignments();
        if(Props.verbose >= 1)
            cout << "NDP done. Induced width was "<<_m_induced_width<<endl;
        
        return(val);
    }